

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

void __thiscall cmSourceFile::SetProperty(cmSourceFile *this,string *prop,char *value)

{
  bool bVar1;
  cmMakefile *this_00;
  cmMakefile *mf;
  char *value_local;
  string *prop_local;
  cmSourceFile *this_local;
  
  cmPropertyMap::SetProperty(&this->Properties,prop,value);
  if ((this->IsUiFile & 1U) != 0) {
    this_00 = cmSourceFileLocation::GetMakefile(&this->Location);
    bVar1 = std::operator==(prop,"AUTOUIC_OPTIONS");
    if (bVar1) {
      cmMakefile::AddQtUiFileWithOptions(this_00,this);
    }
  }
  return;
}

Assistant:

void cmSourceFile::SetProperty(const std::string& prop, const char* value)
{
  this->Properties.SetProperty(prop, value);

  if (this->IsUiFile) {
    cmMakefile const* mf = this->Location.GetMakefile();
    if (prop == "AUTOUIC_OPTIONS") {
      const_cast<cmMakefile*>(mf)->AddQtUiFileWithOptions(this);
    }
  }
}